

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleReadElfCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  StringEntry *pSVar6;
  ostream *poVar7;
  size_type sVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin0;
  pointer pbVar9;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end0;
  string_view arg;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string rpath;
  Arguments arguments;
  cmELF elf;
  string local_228;
  string local_208;
  string local_1e8;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [16];
  undefined1 auStack_198 [96];
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x80) {
    local_1a8._0_8_ = auStack_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "READ_ELF must be called with at least three additional arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != auStack_198) {
      operator_delete((void *)local_1a8._0_8_,auStack_198._0_8_ + 1);
    }
    bVar4 = false;
  }
  else {
    if (HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
        ::parser == '\0') {
      iVar5 = __cxa_guard_acquire(&HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::parser);
      if (iVar5 != 0) {
        local_1a8._0_8_ = (pointer)0x0;
        local_1a8._8_8_ = (string *)0x0;
        auStack_198._0_8_ = 0;
        name.super_string_view._M_str = "RPATH";
        name.super_string_view._M_len = 5;
        cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                    *)local_1a8,name,0);
        name_00.super_string_view._M_str = "RUNPATH";
        name_00.super_string_view._M_len = 7;
        cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                    *)local_1a8,name_00,0x20);
        name_01.super_string_view._M_str = "CAPTURE_ERROR";
        name_01.super_string_view._M_len = 0xd;
        cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                    *)local_1a8,name_01,0x40);
        std::
        vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
        ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                  *)&HandleReadElfCommand::parser,
                 (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                  *)local_1a8);
        std::
        vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
        ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                   *)local_1a8);
        __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleReadElfCommand::parser,
                     &__dso_handle);
        __cxa_guard_release(&HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                             ::parser);
      }
    }
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 2;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    local_1c8 = &local_1b8;
    local_1c0 = 0;
    local_1b8 = 0;
    local_1a8._0_8_ = &HandleReadElfCommand::parser;
    local_1a8._8_8_ = (string *)0x0;
    auStack_198._0_8_ = 0;
    auStack_198[8] = '\0';
    if (pbVar9 != pbVar2) {
      do {
        arg._M_str = (pbVar9->_M_dataplus)._M_p;
        arg._M_len = pbVar9->_M_string_length;
        ArgumentParser::Instance::Consume
                  ((Instance *)local_1a8,arg,&local_208,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x0);
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != pbVar2);
    }
    bVar4 = cmsys::SystemTools::FileExists(pbVar1 + 1,true);
    if (bVar4) {
      cmELF::cmELF((cmELF *)local_1a8,pbVar1[1]._M_dataplus._M_p);
      if (local_208._M_string_length != 0) {
        pSVar6 = cmELF::GetRPath((cmELF *)local_1a8);
        if (pSVar6 != (StringEntry *)0x0) {
          pcVar3 = (pSVar6->Value)._M_dataplus._M_p;
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_228,pcVar3,pcVar3 + (pSVar6->Value)._M_string_length);
          if (local_228._M_string_length != 0) {
            sVar8 = 0;
            do {
              if (local_228._M_dataplus._M_p[sVar8] == ':') {
                local_228._M_dataplus._M_p[sVar8] = ';';
              }
              sVar8 = sVar8 + 1;
            } while (local_228._M_string_length != sVar8);
          }
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&local_208,local_228._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (local_1e8._M_string_length != 0) {
        pSVar6 = cmELF::GetRunPath((cmELF *)local_1a8);
        if (pSVar6 != (StringEntry *)0x0) {
          pcVar3 = (pSVar6->Value)._M_dataplus._M_p;
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_228,pcVar3,pcVar3 + (pSVar6->Value)._M_string_length);
          if (local_228._M_string_length != 0) {
            sVar8 = 0;
            do {
              if (local_228._M_dataplus._M_p[sVar8] == ':') {
                local_228._M_dataplus._M_p[sVar8] = ';';
              }
              sVar8 = sVar8 + 1;
            } while (local_228._M_string_length != sVar8);
          }
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&local_1e8,local_228._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
        }
      }
      cmELF::~cmELF((cmELF *)local_1a8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"READ_ELF given FILE \"",0x15);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,pbVar1[1]._M_dataplus._M_p,pbVar1[1]._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" that does not exist.",0x16);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                               local_1e8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar4;
}

Assistant:

bool cmFileCommand::HandleReadElfCommand(std::vector<std::string> const& args)
{
  if (args.size() < 4) {
    this->SetError("READ_ELF must be called with at least three additional "
                   "arguments.");
    return false;
  }

  std::string const& fileNameArg = args[1];

  struct Arguments
  {
    std::string RPath;
    std::string RunPath;
    std::string Error;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("RPATH"_s, &Arguments::RPath)
                               .Bind("RUNPATH"_s, &Arguments::RunPath)
                               .Bind("CAPTURE_ERROR"_s, &Arguments::Error);
  Arguments const arguments = parser.Parse(cmMakeRange(args).advance(2));

  if (!cmSystemTools::FileExists(fileNameArg, true)) {
    std::ostringstream e;
    e << "READ_ELF given FILE \"" << fileNameArg << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }

#if defined(CMAKE_USE_ELF_PARSER)
  cmELF elf(fileNameArg.c_str());

  if (!arguments.RPath.empty()) {
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      std::string rpath(se_rpath->Value);
      std::replace(rpath.begin(), rpath.end(), ':', ';');
      this->Makefile->AddDefinition(arguments.RPath, rpath.c_str());
    }
  }
  if (!arguments.RunPath.empty()) {
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      std::string runpath(se_runpath->Value);
      std::replace(runpath.begin(), runpath.end(), ':', ';');
      this->Makefile->AddDefinition(arguments.RunPath, runpath.c_str());
    }
  }

  return true;
#else
  std::string error = "ELF parser not available on this platform.";
  if (arguments.Error.empty()) {
    this->SetError(error);
    return false;
  }
  this->Makefile->AddDefinition(arguments.Error, error.c_str());
  return true;
#endif
}